

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O3

string * __thiscall
MMIntern::MemoryClass::readString_abi_cxx11_
          (string *__return_storage_ptr__,MemoryClass *this,size_t _size)

{
  size_t sVar1;
  pointer pcVar2;
  ulong uVar3;
  size_t sVar4;
  
  sVar1 = this->readPos;
  pcVar2 = (this->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar2;
  sVar4 = uVar3 - sVar1;
  if (sVar1 + _size <= uVar3) {
    sVar4 = _size;
  }
  pcVar2 = pcVar2 + sVar1;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar4);
  this->readPos = this->readPos + sVar4;
  return __return_storage_ptr__;
}

Assistant:

std::string MMIntern::MemoryClass::readString(std::size_t _size)
{
    if (readPos + _size > mem.size())
    {
        _size = mem.size() - readPos;
    }
    std::string str(mem.data() + readPos, _size);
    readPos += _size;
    return str;
}